

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void stats_arena_lextents_print(emitter_t *emitter,uint i,uint64_t uptime)

{
  tsd_t *ptVar1;
  int iVar2;
  tsd_t *ptVar3;
  uint64_t in_RDX;
  emitter_t *in_RDI;
  long *in_FS_OFFSET;
  size_t sz_8;
  size_t miblen_new_10;
  size_t sz_7;
  size_t miblen_new_9;
  size_t sz_6;
  size_t miblen_new_8;
  size_t sz_5;
  size_t miblen_new_7;
  size_t sz_4;
  size_t miblen_new_6;
  size_t sz_3;
  size_t miblen_new_5;
  size_t sz_2;
  size_t miblen_new_4;
  prof_stats_t prof_accum;
  prof_stats_t prof_live;
  size_t curlextents;
  size_t lextent_size;
  uint64_t nrequests;
  uint64_t ndalloc;
  uint64_t nmalloc;
  size_t miblen_new_3;
  size_t prof_stats_mib [7];
  size_t miblen_new_2;
  size_t arenas_lextent_mib [7];
  size_t miblen_new_1;
  size_t miblen_new;
  size_t stats_arenas_mib [7];
  emitter_col_t header_curlextents;
  emitter_col_t col_curlextents;
  emitter_col_t header_prof_accum_count;
  emitter_col_t col_prof_accum_count;
  emitter_col_t header_prof_accum_requested;
  emitter_col_t col_prof_accum_requested;
  emitter_col_t header_prof_live_count;
  emitter_col_t col_prof_live_count;
  emitter_col_t header_prof_live_requested;
  emitter_col_t col_prof_live_requested;
  emitter_col_t header_nrequests_ps;
  emitter_col_t col_nrequests_ps;
  emitter_col_t header_nrequests;
  emitter_col_t col_nrequests;
  emitter_col_t header_ndalloc_ps;
  emitter_col_t col_ndalloc_ps;
  emitter_col_t header_ndalloc;
  emitter_col_t col_ndalloc;
  emitter_col_t header_nmalloc_ps;
  emitter_col_t col_nmalloc_ps;
  emitter_col_t header_nmalloc;
  emitter_col_t col_nmalloc;
  emitter_col_t header_allocated;
  emitter_col_t col_allocated;
  emitter_col_t header_ind;
  emitter_col_t col_ind;
  emitter_col_t header_size;
  emitter_col_t col_size;
  _Bool prof_stats_on;
  emitter_row_t row;
  emitter_row_t header_row;
  size_t sz_1;
  size_t sz;
  _Bool in_gap_prev;
  _Bool in_gap;
  uint j;
  uint nlextents;
  uint nbins;
  tsd_t *tsd;
  tsd_t *tsd_1;
  tsd_t *tsd_2;
  tsd_t *tsd_3;
  tsd_t *tsd_4;
  tsd_t *tsd_5;
  tsd_t *tsd_6;
  tsd_t *tsd_7;
  tsd_t *tsd_8;
  tsd_t *tsd_9;
  tsd_t *tsd_10;
  char *in_stack_fffffffffffff7d8;
  undefined8 *value;
  emitter_t *in_stack_fffffffffffff7e0;
  emitter_type_t value_type;
  emitter_row_t *in_stack_fffffffffffff7e8;
  _Bool _Var4;
  undefined1 minimal;
  tsd_t *in_stack_fffffffffffff7f0;
  size_t *in_stack_fffffffffffff7f8;
  tsd_t *in_stack_fffffffffffff800;
  size_t *in_stack_fffffffffffff808;
  tsd_t *in_stack_fffffffffffff810;
  undefined8 local_7e8;
  undefined8 local_7e0;
  undefined8 local_7d8;
  size_t *in_stack_fffffffffffff830;
  void *in_stack_fffffffffffff838;
  size_t in_stack_fffffffffffff840;
  long local_778;
  long local_770;
  uint64_t in_stack_fffffffffffff898;
  uint64_t in_stack_fffffffffffff8a0;
  uint64_t local_758;
  emitter_col_t local_678;
  emitter_col_t local_650;
  emitter_col_t local_628;
  emitter_col_t local_600;
  emitter_col_t local_5d8;
  emitter_col_t local_5b0;
  emitter_col_t local_588;
  emitter_col_t local_560;
  emitter_col_t local_538;
  emitter_col_t local_510;
  emitter_col_t local_4e8;
  emitter_col_t local_4c0;
  emitter_col_t local_498;
  emitter_col_t local_470;
  emitter_col_t local_448;
  emitter_col_t local_420;
  emitter_col_t local_3f8;
  emitter_col_t local_3d0;
  emitter_col_t local_3a8;
  emitter_col_t local_380;
  emitter_col_t local_358;
  emitter_col_t local_330;
  emitter_col_t local_308;
  emitter_col_t local_2e0;
  emitter_col_t local_2b8;
  emitter_col_t local_290;
  emitter_col_t local_268;
  emitter_col_t local_240;
  byte local_211;
  emitter_row_t local_210;
  emitter_row_t local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  byte local_1ee;
  byte local_1ed;
  uint local_1ec;
  uint local_1e8;
  int local_1e4;
  uint64_t local_1e0;
  emitter_t *local_1d0;
  tsd_t *local_1c8;
  undefined1 local_1ba;
  undefined1 local_1b9;
  tsd_t *local_1b8;
  tsd_t *local_1b0;
  undefined1 local_1a2;
  undefined1 local_1a1;
  tsd_t *local_1a0;
  tsd_t *local_198;
  undefined1 local_18a;
  undefined1 local_189;
  tsd_t *local_188;
  tsd_t *local_180;
  undefined1 local_172;
  undefined1 local_171;
  tsd_t *local_170;
  tsd_t *local_168;
  undefined1 local_15a;
  undefined1 local_159;
  tsd_t *local_158;
  tsd_t *local_150;
  undefined1 local_142;
  undefined1 local_141;
  tsd_t *local_140;
  tsd_t *local_138;
  undefined1 local_12a;
  undefined1 local_129;
  tsd_t *local_128;
  tsd_t *local_120;
  undefined1 local_112;
  undefined1 local_111;
  tsd_t *local_110;
  tsd_t *local_108;
  undefined1 local_fa;
  undefined1 local_f9;
  tsd_t *local_f8;
  tsd_t *local_f0;
  undefined1 local_e2;
  undefined1 local_e1;
  tsd_t *local_e0;
  tsd_t *local_d8;
  undefined1 local_ca;
  undefined1 local_c9;
  tsd_t *local_c8;
  undefined1 local_bb;
  undefined1 local_ba;
  undefined1 local_b9;
  undefined1 local_b8;
  undefined1 local_b7;
  undefined1 local_b6;
  undefined1 local_b5;
  undefined1 local_b4;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  tsd_t *local_b0;
  tsd_t *local_a8;
  tsd_t *local_a0;
  tsd_t *local_98;
  tsd_t *local_90;
  tsd_t *local_88;
  tsd_t *local_80;
  tsd_t *local_78;
  tsd_t *local_70;
  tsd_t *local_68;
  tsd_t *local_60;
  tsd_t *local_58;
  tsd_t *local_50;
  tsd_t *local_48;
  tsd_t *local_40;
  tsd_t *local_38;
  tsd_t *local_30;
  tsd_t *local_28;
  tsd_t *local_20;
  tsd_t *local_18;
  tsd_t *local_10;
  tsd_t *local_8;
  
  local_1f8 = 4;
  local_1e0 = in_RDX;
  local_1d0 = in_RDI;
  iVar2 = duckdb_je_mallctl(&in_stack_fffffffffffff800->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffff7f8,(size_t *)in_stack_fffffffffffff7f0,
                            in_stack_fffffffffffff7e8,(size_t)in_stack_fffffffffffff7e0);
  if (iVar2 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","arenas.nbins");
    abort();
  }
  local_200 = 4;
  iVar2 = duckdb_je_mallctl(&in_stack_fffffffffffff800->
                             cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled,
                            in_stack_fffffffffffff7f8,(size_t *)in_stack_fffffffffffff7f0,
                            in_stack_fffffffffffff7e8,(size_t)in_stack_fffffffffffff7e0);
  if (iVar2 != 0) {
    duckdb_je_malloc_printf("<jemalloc>: Failure in xmallctl(\"%s\", ...)\n","arenas.nlextents");
    abort();
  }
  emitter_row_init(&local_208);
  emitter_row_init(&local_210);
  local_211 = 0;
  emitter_col_init(&local_240,&local_210);
  local_240.justify = emitter_justify_right;
  local_240.width = 0x14;
  local_240.type = emitter_type_size;
  emitter_col_init(&local_268,&local_208);
  local_268.justify = emitter_justify_right;
  local_268.width = 0x14;
  local_268.type = emitter_type_title;
  local_268.field_3.str_val = "size";
  emitter_col_init(&local_290,&local_210);
  local_290.justify = emitter_justify_right;
  local_290.width = 4;
  local_290.type = emitter_type_unsigned;
  emitter_col_init(&local_2b8,&local_208);
  local_2b8.justify = emitter_justify_right;
  local_2b8.width = 4;
  local_2b8.type = emitter_type_title;
  local_2b8.field_3.str_val = "ind";
  emitter_col_init(&local_2e0,&local_210);
  local_2e0.justify = emitter_justify_right;
  local_2e0.width = 0xd;
  local_2e0.type = emitter_type_size;
  emitter_col_init(&local_308,&local_208);
  local_308.justify = emitter_justify_right;
  local_308.width = 0xd;
  local_308.type = emitter_type_title;
  local_308.field_3.str_val = "allocated";
  emitter_col_init(&local_330,&local_210);
  local_330.justify = emitter_justify_right;
  local_330.width = 0xd;
  local_330.type = emitter_type_uint64;
  emitter_col_init(&local_358,&local_208);
  local_358.justify = emitter_justify_right;
  local_358.width = 0xd;
  local_358.type = emitter_type_title;
  local_358.field_3.str_val = "nmalloc";
  emitter_col_init(&local_380,&local_210);
  local_380.justify = emitter_justify_right;
  local_380.width = 8;
  local_380.type = emitter_type_uint64;
  emitter_col_init(&local_3a8,&local_208);
  local_3a8.justify = emitter_justify_right;
  local_3a8.width = 8;
  local_3a8.type = emitter_type_title;
  local_3a8.field_3.str_val = "(#/sec)";
  emitter_col_init(&local_3d0,&local_210);
  local_3d0.justify = emitter_justify_right;
  local_3d0.width = 0xd;
  local_3d0.type = emitter_type_uint64;
  emitter_col_init(&local_3f8,&local_208);
  local_3f8.justify = emitter_justify_right;
  local_3f8.width = 0xd;
  local_3f8.type = emitter_type_title;
  local_3f8.field_3.str_val = "ndalloc";
  emitter_col_init(&local_420,&local_210);
  local_420.justify = emitter_justify_right;
  local_420.width = 8;
  local_420.type = emitter_type_uint64;
  emitter_col_init(&local_448,&local_208);
  local_448.justify = emitter_justify_right;
  local_448.width = 8;
  local_448.type = emitter_type_title;
  local_448.field_3.str_val = "(#/sec)";
  emitter_col_init(&local_470,&local_210);
  local_470.justify = emitter_justify_right;
  local_470.width = 0xd;
  local_470.type = emitter_type_uint64;
  emitter_col_init(&local_498,&local_208);
  local_498.justify = emitter_justify_right;
  local_498.width = 0xd;
  local_498.type = emitter_type_title;
  local_498.field_3.str_val = "nrequests";
  emitter_col_init(&local_4c0,&local_210);
  local_4c0.justify = emitter_justify_right;
  local_4c0.width = 8;
  local_4c0.type = emitter_type_uint64;
  emitter_col_init(&local_4e8,&local_208);
  local_4e8.justify = emitter_justify_right;
  local_4e8.width = 8;
  local_4e8.type = emitter_type_title;
  local_4e8.field_3.str_val = "(#/sec)";
  if ((local_211 & 1) != 0) {
    emitter_col_init(&local_510,&local_210);
    local_510.justify = emitter_justify_right;
    local_510.width = 0x15;
    local_510.type = emitter_type_uint64;
    emitter_col_init(&local_538,&local_208);
    local_538.justify = emitter_justify_right;
    local_538.width = 0x15;
    local_538.type = emitter_type_title;
    local_538.field_3.str_val = "prof_live_requested";
    emitter_col_init(&local_560,&local_210);
    local_560.justify = emitter_justify_right;
    local_560.width = 0x11;
    local_560.type = emitter_type_uint64;
    emitter_col_init(&local_588,&local_208);
    local_588.justify = emitter_justify_right;
    local_588.width = 0x11;
    local_588.type = emitter_type_title;
    local_588.field_3.str_val = "prof_live_count";
    emitter_col_init(&local_5b0,&local_210);
    local_5b0.justify = emitter_justify_right;
    local_5b0.width = 0x15;
    local_5b0.type = emitter_type_uint64;
    emitter_col_init(&local_5d8,&local_208);
    local_5d8.justify = emitter_justify_right;
    local_5d8.width = 0x15;
    local_5d8.type = emitter_type_title;
    local_5d8.field_3.str_val = "prof_accum_requested";
    emitter_col_init(&local_600,&local_210);
    local_600.justify = emitter_justify_right;
    local_600.width = 0x11;
    local_600.type = emitter_type_uint64;
    emitter_col_init(&local_628,&local_208);
    local_628.justify = emitter_justify_right;
    local_628.width = 0x11;
    local_628.type = emitter_type_title;
    local_628.field_3.str_val = "prof_accum_count";
  }
  emitter_col_init(&local_650,&local_210);
  local_650.justify = emitter_justify_right;
  local_650.width = 0xd;
  local_650.type = emitter_type_size;
  emitter_col_init(&local_678,&local_208);
  local_678.justify = emitter_justify_right;
  local_678.width = 0xd;
  local_678.type = emitter_type_title;
  local_678.field_3.str_val = "curlextents";
  local_268.width = local_268.width + -6;
  emitter_table_printf(local_1d0,"large:");
  emitter_table_row((emitter_t *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  emitter_json_array_kv_begin(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
  local_1b9 = 1;
  local_1ba = 0;
  local_b1 = 1;
  local_1c8 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
  local_1b8 = local_1c8;
  local_60 = local_1c8;
  ptVar3 = local_1c8;
  if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
    local_1b8 = duckdb_je_tsd_fetch_slow
                          (in_stack_fffffffffffff7f0,
                           SUB81((ulong)in_stack_fffffffffffff7e8 >> 0x38,0));
    ptVar3 = local_8;
  }
  local_8 = ptVar3;
  iVar2 = duckdb_je_ctl_mibnametomib
                    (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                     (size_t)in_stack_fffffffffffff7f0,(char *)in_stack_fffffffffffff7e8,
                     (size_t *)in_stack_fffffffffffff7e0);
  if (iVar2 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in ctl_mibnametomib()\n");
    abort();
  }
  local_1a1 = 1;
  local_1a2 = 0;
  local_b2 = 1;
  local_1b0 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
  local_1a0 = local_1b0;
  local_68 = local_1b0;
  ptVar3 = local_1b0;
  if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
    local_1a0 = duckdb_je_tsd_fetch_slow
                          (in_stack_fffffffffffff7f0,
                           SUB81((ulong)in_stack_fffffffffffff7e8 >> 0x38,0));
    ptVar3 = local_10;
  }
  local_10 = ptVar3;
  iVar2 = duckdb_je_ctl_mibnametomib
                    (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                     (size_t)in_stack_fffffffffffff7f0,(char *)in_stack_fffffffffffff7e8,
                     (size_t *)in_stack_fffffffffffff7e0);
  if (iVar2 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in ctl_mibnametomib()\n");
    abort();
  }
  local_189 = 1;
  local_18a = 0;
  local_b3 = 1;
  local_198 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
  local_188 = local_198;
  local_70 = local_198;
  ptVar3 = local_198;
  if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
    local_188 = duckdb_je_tsd_fetch_slow
                          (in_stack_fffffffffffff7f0,
                           SUB81((ulong)in_stack_fffffffffffff7e8 >> 0x38,0));
    ptVar3 = local_18;
  }
  local_18 = ptVar3;
  iVar2 = duckdb_je_ctl_mibnametomib
                    (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                     (size_t)in_stack_fffffffffffff7f0,(char *)in_stack_fffffffffffff7e8,
                     (size_t *)in_stack_fffffffffffff7e0);
  if (iVar2 != 0) {
    duckdb_je_malloc_write("<jemalloc>: Failure in ctl_mibnametomib()\n");
    abort();
  }
  if ((local_211 & 1) != 0) {
    local_171 = 1;
    local_172 = 0;
    local_b4 = 1;
    local_180 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
    local_170 = local_180;
    local_78 = local_180;
    ptVar3 = local_180;
    if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
      local_170 = duckdb_je_tsd_fetch_slow
                            (in_stack_fffffffffffff7f0,
                             SUB81((ulong)in_stack_fffffffffffff7e8 >> 0x38,0));
      ptVar3 = local_20;
    }
    local_20 = ptVar3;
    iVar2 = duckdb_je_ctl_mibnametomib
                      (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                       (size_t)in_stack_fffffffffffff7f0,(char *)in_stack_fffffffffffff7e8,
                       (size_t *)in_stack_fffffffffffff7e0);
    if (iVar2 != 0) {
      duckdb_je_malloc_write("<jemalloc>: Failure in ctl_mibnametomib()\n");
      abort();
    }
  }
  local_1ec = 0;
  local_1ed = 0;
  while( true ) {
    if (local_1e8 <= local_1ec) {
      emitter_json_array_end((emitter_t *)0x25787f8);
      if ((local_1ed & 1) != 0) {
        emitter_table_printf(local_1d0,"                     ---\n");
      }
      return;
    }
    local_159 = 1;
    local_15a = 0;
    local_b5 = 1;
    local_168 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
    ptVar3 = local_168;
    local_80 = local_168;
    ptVar1 = local_168;
    if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
      ptVar3 = duckdb_je_tsd_fetch_slow
                         (in_stack_fffffffffffff7f0,
                          SUB81((ulong)in_stack_fffffffffffff7e8 >> 0x38,0));
      ptVar1 = local_28;
    }
    local_28 = ptVar1;
    local_158 = ptVar3;
    _Var4 = false;
    iVar2 = duckdb_je_ctl_bymibname
                      (in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                       (size_t)in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8,
                       (size_t *)in_stack_fffffffffffff7f0,(void *)0x0,in_stack_fffffffffffff830,
                       in_stack_fffffffffffff838,in_stack_fffffffffffff840);
    if (iVar2 != 0) {
      duckdb_je_malloc_write("<jemalloc>: Failure in ctl_bymibname()\n");
      abort();
    }
    local_141 = 1;
    local_142 = 0;
    local_b6 = 1;
    local_150 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
    ptVar3 = local_150;
    local_88 = local_150;
    ptVar1 = local_150;
    if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
      ptVar3 = duckdb_je_tsd_fetch_slow(in_stack_fffffffffffff7f0,_Var4);
      ptVar1 = local_30;
    }
    local_30 = ptVar1;
    local_140 = ptVar3;
    _Var4 = false;
    iVar2 = duckdb_je_ctl_bymibname
                      (in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                       (size_t)in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8,
                       (size_t *)in_stack_fffffffffffff7f0,(void *)0x0,in_stack_fffffffffffff830,
                       in_stack_fffffffffffff838,in_stack_fffffffffffff840);
    if (iVar2 != 0) {
      duckdb_je_malloc_write("<jemalloc>: Failure in ctl_bymibname()\n");
      abort();
    }
    in_stack_fffffffffffff840 = 7;
    in_stack_fffffffffffff838 = (void *)0x8;
    local_129 = 1;
    local_12a = 0;
    local_b7 = 1;
    local_138 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
    ptVar3 = local_138;
    local_90 = local_138;
    ptVar1 = local_138;
    if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
      ptVar3 = duckdb_je_tsd_fetch_slow(in_stack_fffffffffffff7f0,_Var4);
      ptVar1 = local_38;
    }
    local_38 = ptVar1;
    local_128 = ptVar3;
    minimal = 0;
    iVar2 = duckdb_je_ctl_bymibname
                      (in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                       (size_t)in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8,
                       (size_t *)in_stack_fffffffffffff7f0,(void *)0x0,in_stack_fffffffffffff830,
                       in_stack_fffffffffffff838,in_stack_fffffffffffff840);
    if (iVar2 != 0) {
      duckdb_je_malloc_write("<jemalloc>: Failure in ctl_bymibname()\n");
      abort();
    }
    local_1ee = local_1ed & 1;
    local_1ed = in_stack_fffffffffffff898 == 0;
    if ((local_1ee != 0) && (!(bool)local_1ed)) {
      emitter_table_printf(local_1d0,"                     ---\n");
    }
    in_stack_fffffffffffff830 = (size_t *)0x7;
    local_7d8 = 8;
    local_111 = 1;
    local_112 = 0;
    local_b8 = 1;
    local_120 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
    ptVar3 = local_120;
    local_98 = local_120;
    ptVar1 = local_120;
    if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
      ptVar3 = duckdb_je_tsd_fetch_slow(in_stack_fffffffffffff7f0,(_Bool)minimal);
      ptVar1 = local_40;
    }
    local_40 = ptVar1;
    local_110 = ptVar3;
    _Var4 = false;
    iVar2 = duckdb_je_ctl_bymibname
                      (in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                       (size_t)in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8,
                       (size_t *)in_stack_fffffffffffff7f0,(void *)0x0,in_stack_fffffffffffff830,
                       in_stack_fffffffffffff838,in_stack_fffffffffffff840);
    if (iVar2 != 0) break;
    local_7e0 = 7;
    local_7e8 = 8;
    local_f9 = 1;
    local_fa = 0;
    local_b9 = 1;
    local_108 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
    ptVar3 = local_108;
    local_a0 = local_108;
    ptVar1 = local_108;
    if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
      ptVar3 = duckdb_je_tsd_fetch_slow(in_stack_fffffffffffff7f0,_Var4);
      ptVar1 = local_48;
    }
    local_48 = ptVar1;
    local_f8 = ptVar3;
    value = &local_7e8;
    value_type = emitter_type_bool;
    in_stack_fffffffffffff7e8 = (emitter_row_t *)0x0;
    iVar2 = duckdb_je_ctl_bymibname
                      (in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                       (size_t)in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8,
                       (size_t *)in_stack_fffffffffffff7f0,(void *)0x0,in_stack_fffffffffffff830,
                       in_stack_fffffffffffff838,in_stack_fffffffffffff840);
    if (iVar2 != 0) {
      duckdb_je_malloc_write("<jemalloc>: Failure in ctl_bymibname()\n");
      abort();
    }
    if ((local_211 & 1) != 0) {
      in_stack_fffffffffffff810 = (tsd_t *)0x7;
      in_stack_fffffffffffff808 = (size_t *)0x10;
      local_e1 = 1;
      local_e2 = 0;
      local_ba = 1;
      local_f0 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
      ptVar3 = local_f0;
      local_a8 = local_f0;
      ptVar1 = local_f0;
      if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
        ptVar3 = duckdb_je_tsd_fetch_slow
                           (in_stack_fffffffffffff7f0,
                            SUB81((ulong)in_stack_fffffffffffff7e8 >> 0x38,0));
        ptVar1 = local_50;
      }
      local_50 = ptVar1;
      local_e0 = ptVar3;
      _Var4 = false;
      iVar2 = duckdb_je_ctl_bymibname
                        (in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                         (size_t)in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8,
                         (size_t *)in_stack_fffffffffffff7f0,(void *)0x0,in_stack_fffffffffffff830,
                         in_stack_fffffffffffff838,in_stack_fffffffffffff840);
      if (iVar2 != 0) {
        duckdb_je_malloc_write("<jemalloc>: Failure in ctl_bymibname()\n");
        abort();
      }
      in_stack_fffffffffffff800 = (tsd_t *)0x7;
      in_stack_fffffffffffff7f8 = (size_t *)0x10;
      local_c9 = 1;
      local_ca = 0;
      local_bb = 1;
      local_d8 = (tsd_t *)(*in_FS_OFFSET + -0x2a90);
      ptVar3 = local_d8;
      local_b0 = local_d8;
      ptVar1 = local_d8;
      if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
        ptVar3 = duckdb_je_tsd_fetch_slow(in_stack_fffffffffffff7f0,_Var4);
        ptVar1 = local_58;
      }
      local_58 = ptVar1;
      local_c8 = ptVar3;
      value = (undefined8 *)&stack0xfffffffffffff7f8;
      value_type = emitter_type_bool;
      in_stack_fffffffffffff7e8 = (emitter_row_t *)0x0;
      iVar2 = duckdb_je_ctl_bymibname
                        (in_stack_fffffffffffff810,in_stack_fffffffffffff808,
                         (size_t)in_stack_fffffffffffff800,(char *)in_stack_fffffffffffff7f8,
                         (size_t *)in_stack_fffffffffffff7f0,(void *)0x0,in_stack_fffffffffffff830,
                         in_stack_fffffffffffff838,in_stack_fffffffffffff840);
      if (iVar2 != 0) {
        duckdb_je_malloc_write("<jemalloc>: Failure in ctl_bymibname()\n");
        abort();
      }
    }
    emitter_json_object_begin((emitter_t *)0x25785cd);
    if ((local_211 & 1) != 0) {
      emitter_json_kv((emitter_t *)in_stack_fffffffffffff7f0,(char *)in_stack_fffffffffffff7e8,
                      value_type,value);
      emitter_json_kv((emitter_t *)in_stack_fffffffffffff7f0,(char *)in_stack_fffffffffffff7e8,
                      value_type,value);
      emitter_json_kv((emitter_t *)in_stack_fffffffffffff7f0,(char *)in_stack_fffffffffffff7e8,
                      value_type,value);
      emitter_json_kv((emitter_t *)in_stack_fffffffffffff7f0,(char *)in_stack_fffffffffffff7e8,
                      value_type,value);
    }
    emitter_json_kv((emitter_t *)in_stack_fffffffffffff7f0,(char *)in_stack_fffffffffffff7e8,
                    value_type,value);
    emitter_json_object_end((emitter_t *)0x2578695);
    local_290.field_3.int_val = local_1e4 + local_1ec;
    local_2e0.field_3.uint64_val = local_778 * local_770;
    local_380.field_3.uint64_val = rate_per_second(local_758,local_1e0);
    local_420.field_3.uint64_val = rate_per_second(in_stack_fffffffffffff8a0,local_1e0);
    local_4c0.field_3.uint64_val = rate_per_second(in_stack_fffffffffffff898,local_1e0);
    if ((local_1ed & 1) == 0) {
      emitter_table_row((emitter_t *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
    }
    local_1ec = local_1ec + 1;
  }
  duckdb_je_malloc_write("<jemalloc>: Failure in ctl_bymibname()\n");
  abort();
}

Assistant:

JEMALLOC_COLD
static void
stats_arena_lextents_print(emitter_t *emitter, unsigned i, uint64_t uptime) {
	unsigned nbins, nlextents, j;
	bool in_gap, in_gap_prev;

	CTL_GET("arenas.nbins", &nbins, unsigned);
	CTL_GET("arenas.nlextents", &nlextents, unsigned);

	emitter_row_t header_row;
	emitter_row_init(&header_row);
	emitter_row_t row;
	emitter_row_init(&row);

	bool prof_stats_on = config_prof && opt_prof && opt_prof_stats
	    && i == MALLCTL_ARENAS_ALL;

	COL_HDR(row, size, NULL, right, 20, size)
	COL_HDR(row, ind, NULL, right, 4, unsigned)
	COL_HDR(row, allocated, NULL, right, 13, size)
	COL_HDR(row, nmalloc, NULL, right, 13, uint64)
	COL_HDR(row, nmalloc_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, ndalloc, NULL, right, 13, uint64)
	COL_HDR(row, ndalloc_ps, "(#/sec)", right, 8, uint64)
	COL_HDR(row, nrequests, NULL, right, 13, uint64)
	COL_HDR(row, nrequests_ps, "(#/sec)", right, 8, uint64)
	COL_HDR_DECLARE(prof_live_requested)
	COL_HDR_DECLARE(prof_live_count)
	COL_HDR_DECLARE(prof_accum_requested)
	COL_HDR_DECLARE(prof_accum_count)
	if (prof_stats_on) {
		COL_HDR_INIT(row, prof_live_requested, NULL, right, 21, uint64)
		COL_HDR_INIT(row, prof_live_count, NULL, right, 17, uint64)
		COL_HDR_INIT(row, prof_accum_requested, NULL, right, 21, uint64)
		COL_HDR_INIT(row, prof_accum_count, NULL, right, 17, uint64)
	}
	COL_HDR(row, curlextents, NULL, right, 13, size)

	/* As with bins, we label the large extents table. */
	header_size.width -= 6;
	emitter_table_printf(emitter, "large:");
	emitter_table_row(emitter, &header_row);
	emitter_json_array_kv_begin(emitter, "lextents");

	size_t stats_arenas_mib[CTL_MAX_DEPTH];
	CTL_LEAF_PREPARE(stats_arenas_mib, 0, "stats.arenas");
	stats_arenas_mib[2] = i;
	CTL_LEAF_PREPARE(stats_arenas_mib, 3, "lextents");

	size_t arenas_lextent_mib[CTL_MAX_DEPTH];
	CTL_LEAF_PREPARE(arenas_lextent_mib, 0, "arenas.lextent");

	size_t prof_stats_mib[CTL_MAX_DEPTH];
	if (prof_stats_on) {
		CTL_LEAF_PREPARE(prof_stats_mib, 0, "prof.stats.lextents");
	}

	for (j = 0, in_gap = false; j < nlextents; j++) {
		uint64_t nmalloc, ndalloc, nrequests;
		size_t lextent_size, curlextents;
		prof_stats_t prof_live;
		prof_stats_t prof_accum;

		stats_arenas_mib[4] = j;
		arenas_lextent_mib[2] = j;

		CTL_LEAF(stats_arenas_mib, 5, "nmalloc", &nmalloc, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "ndalloc", &ndalloc, uint64_t);
		CTL_LEAF(stats_arenas_mib, 5, "nrequests", &nrequests,
		    uint64_t);

		in_gap_prev = in_gap;
		in_gap = (nrequests == 0);

		if (in_gap_prev && !in_gap) {
			emitter_table_printf(emitter,
			    "                     ---\n");
		}

		CTL_LEAF(arenas_lextent_mib, 3, "size", &lextent_size, size_t);
		CTL_LEAF(stats_arenas_mib, 5, "curlextents", &curlextents,
		    size_t);

		if (prof_stats_on) {
			prof_stats_mib[3] = j;
			CTL_LEAF(prof_stats_mib, 4, "live", &prof_live,
			    prof_stats_t);
			CTL_LEAF(prof_stats_mib, 4, "accum", &prof_accum,
			    prof_stats_t);
		}

		emitter_json_object_begin(emitter);
		if (prof_stats_on) {
			emitter_json_kv(emitter, "prof_live_requested",
			    emitter_type_uint64, &prof_live.req_sum);
			emitter_json_kv(emitter, "prof_live_count",
			    emitter_type_uint64, &prof_live.count);
			emitter_json_kv(emitter, "prof_accum_requested",
			    emitter_type_uint64, &prof_accum.req_sum);
			emitter_json_kv(emitter, "prof_accum_count",
			    emitter_type_uint64, &prof_accum.count);
		}
		emitter_json_kv(emitter, "curlextents", emitter_type_size,
		    &curlextents);
		emitter_json_object_end(emitter);

		col_size.size_val = lextent_size;
		col_ind.unsigned_val = nbins + j;
		col_allocated.size_val = curlextents * lextent_size;
		col_nmalloc.uint64_val = nmalloc;
		col_nmalloc_ps.uint64_val = rate_per_second(nmalloc, uptime);
		col_ndalloc.uint64_val = ndalloc;
		col_ndalloc_ps.uint64_val = rate_per_second(ndalloc, uptime);
		col_nrequests.uint64_val = nrequests;
		col_nrequests_ps.uint64_val = rate_per_second(nrequests, uptime);
		if (prof_stats_on) {
			col_prof_live_requested.uint64_val = prof_live.req_sum;
			col_prof_live_count.uint64_val = prof_live.count;
			col_prof_accum_requested.uint64_val =
			    prof_accum.req_sum;
			col_prof_accum_count.uint64_val = prof_accum.count;
		}
		col_curlextents.size_val = curlextents;

		if (!in_gap) {
			emitter_table_row(emitter, &row);
		}
	}
	emitter_json_array_end(emitter); /* Close "lextents". */
	if (in_gap) {
		emitter_table_printf(emitter, "                     ---\n");
	}
}